

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<cvertex_t,_int,_THashTraits<cvertex_t>,_TValueTraits<int>_>::FindKey
          (TMap<cvertex_t,_int,_THashTraits<cvertex_t>,_TValueTraits<int>_> *this,cvertex_t key)

{
  undefined1 auVar1 [16];
  Node *pNVar2;
  Node *pNVar3;
  uint uVar4;
  
  uVar4 = SUB84(key.Y + 6755399441055744.0,0) * 0x10000 + SUB84(key.X + 6755399441055744.0,0);
  pNVar3 = this->Nodes + (this->Size - 1 & uVar4);
  while( true ) {
    if (pNVar3 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pNVar2 = pNVar3;
    if (pNVar3->Next == (Node *)0x1) break;
    auVar1._8_8_ = -(ulong)(ABS((pNVar3->Pair).Key.Y - key.Y) < 1.52587890625e-05) << 0x3f;
    auVar1._0_8_ = -(ulong)(ABS((pNVar3->Pair).Key.X - key.X) < 1.52587890625e-05) << 0x3f;
    uVar4 = movmskpd(uVar4,auVar1);
    pNVar3 = pNVar3->Next;
    if (uVar4 == 3) {
      return pNVar2;
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *FindKey(const KT key)
	{
		HashTraits Traits;
		Node *n = MainPosition(key);
		while (n != NULL && !n->IsNil() && Traits.Compare(n->Pair.Key, key))
		{
			n = n->Next;
		}
		return n == NULL || n->IsNil() ? NULL : n;
	}